

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3PendingListAppendVarint(PendingList **pp,sqlite3_int64 i)

{
  int iVar1;
  int iVar2;
  PendingList *pOld;
  PendingList *pPVar3;
  long lVar4;
  
  pOld = *pp;
  if (pOld == (PendingList *)0x0) {
    pOld = (PendingList *)sqlite3_malloc64(0x94);
    if (pOld == (PendingList *)0x0) {
      return 7;
    }
    pOld->nSpace = 100;
    pPVar3 = pOld + 1;
    pOld->aData = (char *)pPVar3;
    pOld->nData = 0;
    iVar2 = 0;
  }
  else {
    iVar2 = pOld->nData;
    iVar1 = pOld->nSpace;
    if (iVar1 < iVar2 + 0xb) {
      pOld = (PendingList *)sqlite3_realloc64(pOld,(long)iVar1 * 2 + 0x30);
      if (pOld == (PendingList *)0x0) {
        sqlite3_free(*pp);
        iVar2 = 7;
        pOld = (PendingList *)0x0;
        goto LAB_001b4d72;
      }
      pOld->nSpace = iVar1 * 2;
      pPVar3 = pOld + 1;
      pOld->aData = (char *)pPVar3;
      iVar2 = pOld->nData;
    }
    else {
      pPVar3 = (PendingList *)pOld->aData;
    }
  }
  iVar2 = sqlite3Fts3PutVarint((char *)((long)&pPVar3->nData + (long)iVar2),i);
  lVar4 = (long)iVar2 + (long)pOld->nData;
  pOld->nData = (int)lVar4;
  pOld->aData[lVar4] = '\0';
  iVar2 = 0;
LAB_001b4d72:
  *pp = pOld;
  return iVar2;
}

Assistant:

static int fts3PendingListAppendVarint(
  PendingList **pp,               /* IN/OUT: Pointer to PendingList struct */
  sqlite3_int64 i                 /* Value to append to data */
){
  PendingList *p = *pp;

  /* Allocate or grow the PendingList as required. */
  if( !p ){
    p = sqlite3_malloc64(sizeof(*p) + 100);
    if( !p ){
      return SQLITE_NOMEM;
    }
    p->nSpace = 100;
    p->aData = (char *)&p[1];
    p->nData = 0;
  }
  else if( p->nData+FTS3_VARINT_MAX+1>p->nSpace ){
    i64 nNew = p->nSpace * 2;
    p = sqlite3_realloc64(p, sizeof(*p) + nNew);
    if( !p ){
      sqlite3_free(*pp);
      *pp = 0;
      return SQLITE_NOMEM;
    }
    p->nSpace = (int)nNew;
    p->aData = (char *)&p[1];
  }

  /* Append the new serialized varint to the end of the list. */
  p->nData += sqlite3Fts3PutVarint(&p->aData[p->nData], i);
  p->aData[p->nData] = '\0';
  *pp = p;
  return SQLITE_OK;
}